

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_GetFromVersions::_Run(_Test_GetFromVersions *this)

{
  bool bVar1;
  allocator local_401;
  Snapshot local_400 [4];
  undefined1 local_3e0 [448];
  undefined1 local_220 [16];
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_GetFromVersions *local_10;
  _Test_GetFromVersions *this_local;
  
  local_10 = this;
  do {
    test::Tester::Tester
              ((Tester *)(local_1b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"foo",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"v1",(allocator *)(local_220 + 0xf));
    DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
    test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
    Status::~Status((Status *)local_1b8);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)(local_220 + 0xf));
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    test::Tester::~Tester((Tester *)(local_1b8 + 8));
    DBTest::dbfull(&this->super_DBTest);
    DBImpl::TEST_CompactMemTable((DBImpl *)local_220);
    Status::~Status((Status *)local_220);
    test::Tester::Tester
              ((Tester *)(local_3e0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x263);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_400,"foo",&local_401);
    DBTest::Get((DBTest *)local_3e0,(string *)this,local_400);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_3e0 + 0x20),(char (*) [3])"v1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::~string((string *)local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    test::Tester::~Tester((Tester *)(local_3e0 + 0x20));
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, GetFromVersions) {
  do {
    ASSERT_OK(Put("foo", "v1"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v1", Get("foo"));
  } while (ChangeOptions());
}